

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

void __thiscall
flatbuffers::(anonymous_namespace)::
SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
          (_anonymous_namespace_ *this,uchar *begin,uchar *end,size_t width,
          anon_class_16_2_e19d79f7 comparator,anon_class_8_1_6663148b swapper)

{
  _anonymous_namespace_ _Var1;
  bool bVar2;
  ulong width_00;
  FieldDef *pFVar3;
  _anonymous_namespace_ *p_Var4;
  FieldDef *pFVar5;
  _anonymous_namespace_ *p_Var6;
  anon_class_8_1_6663148b in_stack_ffffffffffffffa8;
  
  pFVar5 = comparator.key;
  if ((long)end < (long)begin - (long)this) {
    width_00 = width & 0xffff;
    do {
      p_Var6 = (_anonymous_namespace_ *)(end + (long)this);
      p_Var4 = (_anonymous_namespace_ *)begin;
      if (p_Var6 < begin) {
        do {
          bVar2 = anon_unknown_0::CompareSerializedScalars
                            ((anon_unknown_0 *)(this + width_00),(uint8_t *)(p_Var6 + width_00),
                             (uint8_t *)(ulong)*(uint *)(comparator._0_8_ + 200),
                             *(FieldDef **)(comparator._0_8_ + 0xe8));
          if (bVar2) {
            p_Var4 = p_Var4 + -(long)end;
            if (pFVar5 != (FieldDef *)0x0) {
              pFVar3 = (FieldDef *)0x0;
              do {
                _Var1 = p_Var6[(long)pFVar3];
                p_Var6[(long)pFVar3] = p_Var4[(long)pFVar3];
                p_Var4[(long)pFVar3] = _Var1;
                pFVar3 = (FieldDef *)((long)&(pFVar3->super_Definition).name._M_dataplus._M_p + 1);
              } while (pFVar5 != pFVar3);
            }
          }
          else {
            p_Var6 = p_Var6 + (long)end;
          }
        } while (p_Var6 < p_Var4);
      }
      p_Var6 = p_Var6 + -(long)end;
      if (pFVar5 != (FieldDef *)0x0) {
        pFVar3 = (FieldDef *)0x0;
        do {
          _Var1 = this[(long)pFVar3];
          this[(long)pFVar3] = p_Var6[(long)pFVar3];
          p_Var6[(long)pFVar3] = _Var1;
          pFVar3 = (FieldDef *)((long)&(pFVar3->super_Definition).name._M_dataplus._M_p + 1);
        } while (pFVar5 != pFVar3);
      }
      SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
                (this,(uchar *)p_Var6,end,width_00,comparator,in_stack_ffffffffffffffa8);
      this = p_Var4;
    } while ((long)end < (long)begin - (long)p_Var4);
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}